

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
         *this,size_t new_capacity)

{
  size_t capacity;
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  slot_type *old_slot;
  FindInfo FVar4;
  Layout LVar5;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_41;
  tuple<unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *local_40;
  ctrl_t *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_38 = this->ctrl_;
    old_slot = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      local_40 = &this->settings_;
      sVar3 = 0;
      do {
        if (-1 < local_38[sVar3]) {
          sVar2 = std::
                  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(&local_41,&(old_slot->key).value);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = sVar2;
          sVar2 = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar4 = find_first_non_full(this,sVar2);
          set_ctrl(this,FVar4.offset,(byte)sVar2 & 0x7f);
          map_slot_policy<phmap::priv::NonStandardLayout,int>::
          transfer<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
                    ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)local_40,
                     this->slots_ + FVar4.offset,old_slot);
        }
        sVar3 = sVar3 + 1;
        old_slot = old_slot + 1;
      } while (capacity != sVar3);
      LVar5 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
                ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)local_40,local_38,
                 LVar5.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<phmap::priv::NonStandardLayout,_int>_>
                 .size_[1] * 0x30 +
                 (LVar5.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<phmap::priv::NonStandardLayout,_int>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }